

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDPDiscrete.cpp
# Opt level: O0

void DecPOMDPDiscrete::CompareModels(DecPOMDPDiscreteInterface *d1,DecPOMDPDiscreteInterface *d2)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  void *pvVar10;
  long *in_RSI;
  long *in_RDI;
  double dVar11;
  double p2_3;
  double p1_3;
  Index ja_2;
  Index s1_2;
  double p2_2;
  double p1_2;
  Index s2_1;
  Index ja_1;
  Index jo;
  Index s1_1;
  double p2_1;
  double p1_1;
  Index s2;
  Index ja;
  Index s1;
  double p2;
  double p1;
  Index sI;
  size_t nrS;
  Index agI_1;
  size_t nrJO;
  Index agI;
  size_t nrJA;
  size_t nrAg;
  double in_stack_ffffffffffffff28;
  double p1_00;
  uint local_a0;
  uint local_9c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_44;
  uint local_34;
  uint local_24;
  
  uVar2 = (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x40)) + 0x10))
                    ((long)in_RDI + *(long *)(*in_RDI + -0x40));
  uVar3 = (**(code **)(*(long *)((long)in_RSI + *(long *)(*in_RSI + -0x40)) + 0x10))
                    ((long)in_RSI + *(long *)(*in_RSI + -0x40));
  if (uVar2 == uVar3) {
    uVar3 = (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0xb8)) + 0x68))
                      ((long)in_RDI + *(long *)(*in_RDI + -0xb8));
    uVar5 = (**(code **)(*(long *)((long)in_RSI + *(long *)(*in_RSI + -0xb8)) + 0x68))
                      ((long)in_RSI + *(long *)(*in_RSI + -0xb8));
    if (uVar3 == uVar5) {
      for (local_24 = 0; local_24 < uVar2; local_24 = local_24 + 1) {
        lVar6 = (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0xb8)) + 0x60))
                          ((long)in_RDI + *(long *)(*in_RDI + -0xb8),local_24);
        lVar7 = (**(code **)(*(long *)((long)in_RSI + *(long *)(*in_RSI + -0xb8)) + 0x60))
                          ((long)in_RSI + *(long *)(*in_RSI + -0xb8),local_24);
        if (lVar6 != lVar7) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "number of actions not the same, stopping comparison");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          return;
        }
      }
      dVar8 = (double)(**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0xb8)) + 200))
                                ((long)in_RDI + *(long *)(*in_RDI + -0xb8));
      p1_00 = dVar8;
      dVar9 = (double)(**(code **)(*(long *)((long)in_RSI + *(long *)(*in_RSI + -0xb8)) + 200))
                                ((long)in_RSI + *(long *)(*in_RSI + -0xb8));
      if (p1_00 == dVar9) {
        for (local_34 = 0; local_34 < uVar2; local_34 = local_34 + 1) {
          in_stack_ffffffffffffff28 =
               (double)(**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0xb8)) + 0xc0))
                                 ((long)in_RDI + *(long *)(*in_RDI + -0xb8),local_34);
          dVar9 = (double)(**(code **)(*(long *)((long)in_RSI + *(long *)(*in_RSI + -0xb8)) + 0xc0))
                                    ((long)in_RSI + *(long *)(*in_RSI + -0xb8),local_34);
          if (in_stack_ffffffffffffff28 != dVar9) {
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "number of observations not the same, stopping comparison");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            return;
          }
        }
        uVar2 = (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0xb8)) + 0x30))
                          ((long)in_RDI + *(long *)(*in_RDI + -0xb8));
        uVar5 = (**(code **)(*(long *)((long)in_RSI + *(long *)(*in_RSI + -0xb8)) + 0x30))
                          ((long)in_RSI + *(long *)(*in_RSI + -0xb8));
        if (uVar5 == uVar2) {
          std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),8);
          for (local_44 = 0; local_44 < uVar2; local_44 = local_44 + 1) {
            dVar9 = (double)(**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0xb8)) + 0x48
                                        ))((long)in_RDI + *(long *)(*in_RDI + -0xb8),local_44);
            dVar11 = (double)(**(code **)(*(long *)((long)in_RSI + *(long *)(*in_RSI + -0xb8)) +
                                         0x48))((long)in_RSI + *(long *)(*in_RSI + -0xb8),local_44);
            bVar1 = Globals::EqualProbability(p1_00,in_stack_ffffffffffffff28);
            if (!bVar1) {
              poVar4 = std::operator<<((ostream *)&std::cout,"Initial probability of sI=");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_44);
              poVar4 = std::operator<<(poVar4," not equal: ");
              poVar4 = std::operator<<(poVar4,"p1=");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar9);
              poVar4 = std::operator<<(poVar4,", p2=");
              pvVar10 = (void *)std::ostream::operator<<(poVar4,dVar11);
              std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
            }
          }
          for (local_5c = 0; local_5c < uVar2; local_5c = local_5c + 1) {
            for (local_60 = 0; local_60 < uVar3; local_60 = local_60 + 1) {
              for (local_64 = 0; local_64 < uVar2; local_64 = local_64 + 1) {
                dVar9 = (double)(**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0xb8)) +
                                            0x108))((long)in_RDI + *(long *)(*in_RDI + -0xb8),
                                                    local_5c,local_60,local_64);
                dVar11 = (double)(**(code **)(*(long *)((long)in_RSI + *(long *)(*in_RSI + -0xb8)) +
                                             0x108))((long)in_RSI + *(long *)(*in_RSI + -0xb8),
                                                     local_5c,local_60,local_64);
                bVar1 = Globals::EqualProbability(p1_00,in_stack_ffffffffffffff28);
                if (!bVar1) {
                  poVar4 = std::operator<<((ostream *)&std::cout,"T(");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_5c);
                  poVar4 = std::operator<<(poVar4,",");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_60);
                  poVar4 = std::operator<<(poVar4,",");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_64);
                  poVar4 = std::operator<<(poVar4,") not equal: ");
                  poVar4 = std::operator<<(poVar4,"p1=");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar9);
                  poVar4 = std::operator<<(poVar4,", p2=");
                  pvVar10 = (void *)std::ostream::operator<<(poVar4,dVar11);
                  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
                }
              }
            }
          }
          for (local_7c = 0; local_7c < uVar2; local_7c = local_7c + 1) {
            for (local_80 = 0; (ulong)local_80 < (ulong)dVar8; local_80 = local_80 + 1) {
              for (local_84 = 0; local_84 < uVar3; local_84 = local_84 + 1) {
                for (local_88 = 0; local_88 < uVar2; local_88 = local_88 + 1) {
                  dVar9 = (double)(**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0xb8))
                                              + 0x120))
                                            ((long)in_RDI + *(long *)(*in_RDI + -0xb8),local_7c,
                                             local_84,local_88,local_80);
                  dVar11 = (double)(**(code **)(*(long *)((long)in_RSI + *(long *)(*in_RSI + -0xb8))
                                               + 0x120))
                                             ((long)in_RSI + *(long *)(*in_RSI + -0xb8),local_7c,
                                              local_84,local_88,local_80);
                  bVar1 = Globals::EqualProbability(p1_00,in_stack_ffffffffffffff28);
                  if (!bVar1) {
                    poVar4 = std::operator<<((ostream *)&std::cout,"O(");
                    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_84);
                    poVar4 = std::operator<<(poVar4,",");
                    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_88);
                    poVar4 = std::operator<<(poVar4,",");
                    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_80);
                    poVar4 = std::operator<<(poVar4,") not equal: ");
                    poVar4 = std::operator<<(poVar4,"p1=");
                    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar9);
                    poVar4 = std::operator<<(poVar4,", p2=");
                    pvVar10 = (void *)std::ostream::operator<<(poVar4,dVar11);
                    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
                  }
                }
              }
            }
          }
          for (local_9c = 0; local_9c < uVar2; local_9c = local_9c + 1) {
            for (local_a0 = 0; local_a0 < uVar3; local_a0 = local_a0 + 1) {
              dVar8 = (double)(**(code **)(*in_RDI + 0xc0))(in_RDI,local_9c,local_a0);
              dVar9 = (double)(**(code **)(*in_RSI + 0xc0))(in_RSI,local_9c,local_a0);
              bVar1 = Globals::EqualProbability(p1_00,in_stack_ffffffffffffff28);
              if (!bVar1) {
                poVar4 = std::operator<<((ostream *)&std::cout,"R(");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_9c);
                poVar4 = std::operator<<(poVar4,",");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_a0);
                poVar4 = std::operator<<(poVar4,") not equal: ");
                poVar4 = std::operator<<(poVar4,"r1=");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar8);
                poVar4 = std::operator<<(poVar4,", r2=");
                pvVar10 = (void *)std::ostream::operator<<(poVar4,dVar9);
                std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
              }
            }
          }
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "number of states not the same, stopping comparison");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "number of joint observations not the same, stopping comparison");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "number of joint actions not the same, stopping comparison");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "number of agents not the same, stopping comparison");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void DecPOMDPDiscrete::CompareModels(
        const DecPOMDPDiscreteInterface& d1, 
        const DecPOMDPDiscreteInterface& d2)
{

    //MultiAgentDecisionProcessInterface level
    //size_t 	GetNrAgents ()
    size_t nrAg = d1.GetNrAgents();
    if(nrAg != d2.GetNrAgents())
    {
        cout << "number of agents not the same, stopping comparison"<<endl;
        return;
    }
    
    //MultiAgentDecisionProcessDiscreteInterface level
    //size_t 	GetNrActions (Index AgentI)
    //size_t 	GetNrJointActions ()
    //size_t 	GetNrJointObservations ()
    //size_t 	GetNrObservations (Index AgentI)
    //size_t 	GetNrStates ()
    //double 	GetInitialStateProbability (Index sI)
    //double 	GetTransitionProbability (Index sI, Index jaI, Index sucSI)
    //double 	GetObservationProbability (Index jaI, Index sucSI, Index joI)
    size_t nrJA = d1.GetNrJointActions();
    if(nrJA != d2.GetNrJointActions())
    {
        cout << "number of joint actions not the same, stopping comparison"
            <<endl;
        return;
    }
    for( Index agI=0; agI < nrAg; agI++)
        if( d1.GetNrActions(agI) != d2.GetNrActions(agI) )
        {
            cout << "number of actions not the same, stopping comparison"
                <<endl;
            return;
        }
    size_t nrJO = d1.GetNrJointObservations();
    if(nrJO != d2.GetNrJointObservations())
    {
        cout << "number of joint observations not the same, stopping comparison"
            <<endl;
        return;
    }
    for( Index agI=0; agI < nrAg; agI++)
        if( d1.GetNrObservations(agI) != d2.GetNrObservations(agI) )
        {
            cout << "number of observations not the same, stopping comparison"
                <<endl;
            return;
        }
    size_t nrS = d1.GetNrStates();
    if(d2.GetNrStates() != nrS)
    {
        cout << "number of states not the same, stopping comparison"
            <<endl;
        return;
    }
    cout.precision(8);
    for( Index sI=0; sI < nrS; sI++)
    {
        double p1 = d1.GetInitialStateProbability(sI);
        double p2 = d2.GetInitialStateProbability(sI);
        if(! Globals::EqualProbability(p1, p2) )
        {
            cout << "Initial probability of sI="<<sI<<" not equal: " <<
                "p1="<<p1<<", p2="<<p2<<endl;
        }
    }

    for( Index s1=0; s1 < nrS; s1++)
        for( Index ja=0; ja < nrJA; ja++)
            for( Index s2=0; s2 < nrS; s2++)
            {
                double p1 = d1.GetTransitionProbability(s1,ja,s2);
                double p2 = d2.GetTransitionProbability(s1,ja,s2);
                if(! Globals::EqualProbability(p1, p2) )
                {

                    cout << "T("<<s1<<","<<ja<<","<<s2<<") not equal: " <<
                        "p1="<<p1<<", p2="<<p2<<endl;
                }
            }
    for( Index s1=0; s1 < nrS; s1++)
    {
        for( Index jo=0; jo < nrJO; jo++)
            for( Index ja=0; ja < nrJA; ja++)
                for( Index s2=0; s2 < nrS; s2++)
                {
                    double p1 = d1.GetObservationProbability(s1,ja,s2,jo);
                    double p2 = d2.GetObservationProbability(s1,ja,s2,jo);
                    if(! Globals::EqualProbability(p1, p2) )
                    {
                        cout << "O("<<ja<<","<<s2<<","<<jo<<") not equal: " <<
                        "p1="<<p1<<", p2="<<p2<<endl;
                    }
                }
    }
    //DecPOMDPDiscreteInterface level
    //double 	GetReward (Index sI, Index jaI)
    //
    for( Index s1=0; s1 < nrS; s1++)
        for( Index ja=0; ja < nrJA; ja++)
        {
            double p1 = d1.GetReward(s1,ja);
            double p2 = d2.GetReward(s1,ja);
            if(! Globals::EqualProbability(p1, p2) )
            {
                cout << "R("<<s1<<","<<ja<<") not equal: " <<
                    "r1="<<p1<<", r2="<<p2<<endl;
            }
        }
    //DecPOMDPInterface level
    //double 	GetDiscount () const
    //reward_t 	GetRewardType () 
    //
    //POSGDiscreteInterface
    //nothing (reward functions, but that's already taken care of at
    //the DecPOMDPDiscreteInterface level)
    //
    //POSGInterface 
    //nothing
    //
    

}